

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  u64 n;
  Fts3Hash *pH;
  int iVar1;
  int iVar2;
  Fts3SegReader **ppFVar3;
  long lVar4;
  Fts3SegReader *pNew;
  Mem *pMVar5;
  i64 iVar6;
  char *zNode;
  sqlite3_int64 *piLeaf2;
  Fts3SegReader *pFVar7;
  Fts3SegReader **pOld;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  Fts3SegReader *pSeg;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (iLevel < 0) {
    iVar1 = 0;
    if ((p->aIndex != (Fts3Index *)0x0) && (iVar1 = 0, p->iPrevLangid == iLangid)) {
      pH = &p->aIndex[iIndex].hPending;
      if (isScan == 0 && isPrefix == 0) {
        pSeg = (Fts3SegReader *)sqlite3Fts3HashFindElem(pH,zTerm,nTerm);
        if (pSeg != (Fts3SegReader *)0x0) {
          uVar8 = 1;
          ppFVar3 = &pSeg;
          goto LAB_001c15f2;
        }
      }
      else {
        pFVar7 = (Fts3SegReader *)pH->first;
        if (pFVar7 == (Fts3SegReader *)0x0) {
          pNew = (Fts3SegReader *)0x0;
          iVar1 = 0;
          pOld = (Fts3SegReader **)0x0;
          pSeg = pFVar7;
LAB_001c1678:
          sqlite3_free(pOld);
        }
        else {
          uVar9 = 0;
          uVar8 = 0;
          pOld = (Fts3SegReader **)0x0;
          do {
            pSeg = pFVar7;
            ppFVar3 = pOld;
            if ((nTerm == 0) ||
               ((nTerm <= (int)pFVar7->iCurrentBlock &&
                (iVar1 = bcmp((void *)pFVar7->iEndBlock,zTerm,(long)nTerm), iVar1 == 0)))) {
              if (uVar8 == uVar9) {
                iVar2 = sqlite3_initialize();
                iVar1 = 7;
                if ((iVar2 != 0) ||
                   (ppFVar3 = (Fts3SegReader **)sqlite3Realloc(pOld,(long)(int)uVar9 * 8 + 0x80),
                   ppFVar3 == (Fts3SegReader **)0x0)) goto LAB_001c166e;
                uVar9 = uVar9 + 0x10;
              }
              lVar4 = (long)(int)uVar8;
              uVar8 = uVar8 + 1;
              ppFVar3[lVar4] = pFVar7;
              pFVar7 = pSeg;
            }
            pFVar7 = *(Fts3SegReader **)pFVar7;
            pOld = ppFVar3;
          } while (pFVar7 != (Fts3SegReader *)0x0);
          pSeg = pFVar7;
          if ((int)uVar8 < 2) {
            if (uVar8 == 1) {
              uVar8 = 1;
              goto LAB_001c15f2;
            }
            iVar1 = 0;
LAB_001c166e:
            pNew = (Fts3SegReader *)0x0;
          }
          else {
            qsort(ppFVar3,(ulong)uVar8,8,fts3CompareElemByTerm);
LAB_001c15f2:
            iVar2 = sqlite3_initialize();
            iVar1 = 7;
            pOld = ppFVar3;
            if (iVar2 != 0) goto LAB_001c166e;
            n = (ulong)uVar8 * 8 + 0x90;
            pNew = (Fts3SegReader *)sqlite3Malloc(n);
            if (pNew == (Fts3SegReader *)0x0) goto LAB_001c166e;
            memset(pNew,0,n);
            pNew->iIdx = 0x7fffffff;
            pNew->ppNextElem = (Fts3HashElem **)(pNew + 1);
            memcpy(pNew + 1,ppFVar3,(ulong)uVar8 << 3);
            iVar1 = 0;
          }
          if (isScan != 0 || isPrefix != 0) goto LAB_001c1678;
        }
        if (pNew != (Fts3SegReader *)0x0 && iVar1 == 0) {
          iVar1 = fts3SegReaderCursorAppend(pCsr,pNew);
        }
      }
    }
    pFVar7 = (Fts3SegReader *)0x0;
    if ((iLevel == -1) || (iVar1 != 0)) goto LAB_001c18ab;
    pSeg = (Fts3SegReader *)0x0;
    iVar1 = fts3SqlStmt(p,0xd,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar7 = pSeg;
    if (iVar1 != 0) goto LAB_001c18ab;
    sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,
                       ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400);
    sqlite3_bind_int64((sqlite3_stmt *)pFVar7,2,
                       ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 | 0x3ff);
  }
  else {
    pSeg = (Fts3SegReader *)0x0;
    iVar1 = fts3SqlStmt(p,0xc,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar7 = pSeg;
    if (iVar1 != 0) goto LAB_001c18ab;
    sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,
                       (ulong)(uint)iLevel +
                       ((long)iIndex + (long)iLangid * (long)p->nIndex) * 0x400);
  }
  piLeaf2 = &iLeavesEndBlock;
  if (isPrefix == 0) {
    piLeaf2 = (sqlite3_int64 *)0x0;
  }
  while (iVar1 = sqlite3_step((sqlite3_stmt *)pFVar7), iVar1 == 100) {
    pSeg = (Fts3SegReader *)0x0;
    pMVar5 = columnMem((sqlite3_stmt *)pFVar7,1);
    iVar6 = sqlite3VdbeIntValue(pMVar5);
    columnMallocFailure((sqlite3_stmt *)pFVar7);
    iStartBlock = iVar6;
    pMVar5 = columnMem((sqlite3_stmt *)pFVar7,2);
    iVar6 = sqlite3VdbeIntValue(pMVar5);
    columnMallocFailure((sqlite3_stmt *)pFVar7);
    iLeavesEndBlock = iVar6;
    pMVar5 = columnMem((sqlite3_stmt *)pFVar7,3);
    iVar6 = sqlite3VdbeIntValue(pMVar5);
    columnMallocFailure((sqlite3_stmt *)pFVar7);
    iVar2 = sqlite3_column_bytes((sqlite3_stmt *)pFVar7,4);
    pMVar5 = columnMem((sqlite3_stmt *)pFVar7,4);
    zNode = (char *)sqlite3_value_blob(pMVar5);
    columnMallocFailure((sqlite3_stmt *)pFVar7);
    if (((zTerm != (char *)0x0) && (iStartBlock != 0)) && (zNode != (char *)0x0)) {
      iVar1 = fts3SelectLeaf(p,zTerm,nTerm,zNode,iVar2,&iStartBlock,piLeaf2);
      if (iVar1 != 0) break;
      if (isScan == 0 && isPrefix == 0) {
        iLeavesEndBlock = iStartBlock;
      }
    }
    iVar1 = sqlite3Fts3SegReaderNew
                      (pCsr->nSegment + 1,(uint)(isScan == 0 && isPrefix == 0),iStartBlock,
                       iLeavesEndBlock,iVar6,zNode,iVar2,&pSeg);
    if ((iVar1 != 0) || (iVar1 = fts3SegReaderCursorAppend(pCsr,pSeg), iVar1 != 0)) break;
  }
LAB_001c18ab:
  iVar2 = sqlite3_reset((sqlite3_stmt *)pFVar7);
  if (iVar1 != 0x65) {
    iVar2 = iVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex && p->iPrevLangid==iLangid ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }

      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1,
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock,
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}